

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode h2_progress_ingress(Curl_cfilter *cf,Curl_easy *data)

{
  CURLcode CVar1;
  cf_h2_ctx *pcVar2;
  Curl_easy *cf_00;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ssize_t sVar7;
  char *pcVar8;
  long local_60;
  _Bool local_51;
  ssize_t nread;
  long lStack_30;
  CURLcode result;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  stream = (stream_ctx *)cf->ctx;
  nread._4_4_ = CURLE_OK;
  ctx = (cf_h2_ctx *)data;
  data_local = (Curl_easy *)cf;
  _Var3 = Curl_bufq_is_empty((bufq *)&(stream->recvbuf).spare);
  cf_00 = data_local;
  pcVar2 = ctx;
  if (!_Var3) {
    if ((((ctx != (cf_h2_ctx *)0x0) &&
         ((*(ulong *)((long)&ctx[0xc].outbufq.opts + 2) >> 0x1c & 1) != 0)) &&
        (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
      sVar5 = Curl_bufq_len((bufq *)&(stream->recvbuf).spare);
      Curl_trc_cf_infof((Curl_easy *)pcVar2,(Curl_cfilter *)cf_00,
                        "Process %zu bytes in connection buffer",sVar5);
    }
    iVar4 = h2_process_pending_input
                      ((Curl_cfilter *)data_local,(Curl_easy *)ctx,(CURLcode *)((long)&nread + 4));
    if (iVar4 < 0) {
      return nread._4_4_;
    }
  }
  while( true ) {
    local_51 = false;
    if (((stream->h1).line_len & 1) == 0) {
      local_51 = Curl_bufq_is_empty((bufq *)&(stream->recvbuf).spare);
    }
    if (local_51 == false) break;
    if ((ctx == (cf_h2_ctx *)0x0) || (ctx[1].stream_bufcp.spare_max == 0)) {
      local_60 = 0;
    }
    else {
      local_60 = *(long *)(ctx[1].stream_bufcp.spare_max + 0x40);
    }
    lStack_30 = local_60;
    if (((local_60 != 0) &&
        (((*(byte *)(local_60 + 0x14d) & 1) != 0 ||
         (_Var3 = Curl_bufq_is_full((bufq *)(local_60 + 8)), _Var3)))) &&
       ((data_local->id == 0 ||
        (uVar6 = (**(code **)(*(long *)data_local->id + 0x38))(data_local->id,ctx), (uVar6 & 1) == 0
        )))) break;
    sVar7 = Curl_bufq_slurp((bufq *)&(stream->recvbuf).spare,nw_in_reader,data_local,
                            (CURLcode *)((long)&nread + 4));
    pcVar2 = ctx;
    CVar1 = nread._4_4_;
    if (sVar7 < 0) {
      if (nread._4_4_ != CURLE_AGAIN) {
        pcVar8 = curl_easy_strerror(nread._4_4_);
        Curl_failf((Curl_easy *)pcVar2,"Failed receiving HTTP2 data: %d(%s)",(ulong)CVar1,pcVar8);
        return nread._4_4_;
      }
      break;
    }
    if (sVar7 == 0) {
      if ((((ctx != (cf_h2_ctx *)0x0) &&
           ((*(ulong *)((long)&ctx[0xc].outbufq.opts + 2) >> 0x1c & 1) != 0)) &&
          (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
        Curl_trc_cf_infof((Curl_easy *)ctx,(Curl_cfilter *)data_local,
                          "[0] ingress: connection closed");
      }
      *(byte *)&(stream->h1).line_len = (byte)(stream->h1).line_len & 0xfe | 1;
      break;
    }
    if (((ctx != (cf_h2_ctx *)0x0) &&
        ((*(ulong *)((long)&ctx[0xc].outbufq.opts + 2) >> 0x1c & 1) != 0)) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)ctx,(Curl_cfilter *)data_local,"[0] ingress: read %zd bytes",
                        sVar7);
    }
    iVar4 = h2_process_pending_input
                      ((Curl_cfilter *)data_local,(Curl_easy *)ctx,(CURLcode *)((long)&nread + 4));
    if (iVar4 != 0) {
      return nread._4_4_;
    }
  }
  if ((((stream->h1).line_len & 1) != 0) &&
     (_Var3 = Curl_bufq_is_empty((bufq *)&(stream->recvbuf).spare), _Var3)) {
    Curl_conncontrol((connectdata *)data_local->prev,1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode h2_progress_ingress(struct Curl_cfilter *cf,
                                    struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;
  CURLcode result = CURLE_OK;
  ssize_t nread;

  /* Process network input buffer fist */
  if(!Curl_bufq_is_empty(&ctx->inbufq)) {
    CURL_TRC_CF(data, cf, "Process %zu bytes in connection buffer",
                Curl_bufq_len(&ctx->inbufq));
    if(h2_process_pending_input(cf, data, &result) < 0)
      return result;
  }

  /* Receive data from the "lower" filters, e.g. network until
   * it is time to stop due to connection close or us not processing
   * all network input */
  while(!ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    stream = H2_STREAM_CTX(data);
    if(stream && (stream->closed || Curl_bufq_is_full(&stream->recvbuf))) {
      /* We would like to abort here and stop processing, so that
       * the transfer loop can handle the data/close here. However,
       * this may leave data in underlying buffers that will not
       * be consumed. */
      if(!cf->next || !cf->next->cft->has_data_pending(cf->next, data))
        break;
    }

    nread = Curl_bufq_slurp(&ctx->inbufq, nw_in_reader, cf, &result);
    if(nread < 0) {
      if(result != CURLE_AGAIN) {
        failf(data, "Failed receiving HTTP2 data: %d(%s)", result,
              curl_easy_strerror(result));
        return result;
      }
      break;
    }
    else if(nread == 0) {
      CURL_TRC_CF(data, cf, "[0] ingress: connection closed");
      ctx->conn_closed = TRUE;
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] ingress: read %zd bytes",
                  nread);
    }

    if(h2_process_pending_input(cf, data, &result))
      return result;
  }

  if(ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    connclose(cf->conn, "GOAWAY received");
  }

  return CURLE_OK;
}